

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O2

Gia_ManTer_t * Gia_ManTerSimulate(Gia_Man_t *pAig,int fVerbose)

{
  Gia_Man_t *p;
  uint **pBins;
  Vec_Ptr_t *pVVar1;
  int i_00;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Gia_ManTer_t *p_00;
  uint *puVar5;
  Gia_Obj_t *pGVar6;
  uint *puVar7;
  uint *puVar8;
  abctime aVar9;
  uint uVar10;
  uint uVar11;
  int Value;
  ulong uVar12;
  int i;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int i_1;
  int iVar17;
  
  aVar4 = Abc_Clock();
  if (pAig->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                  ,0x2a2,"Gia_ManTer_t *Gia_ManTerSimulate(Gia_Man_t *, int)");
  }
  Abc_Clock();
  p_00 = Gia_ManTerCreate(pAig);
  p = p_00->pAig;
  for (iVar13 = 0; iVar2 = p->vCis->nSize, iVar13 < iVar2 - p->nRegs; iVar13 = iVar13 + 1) {
    Gia_ManTerSimInfoSet(p_00->pDataSimCis,iVar13,3);
  }
  for (; iVar13 < iVar2; iVar13 = iVar13 + 1) {
    Gia_ManTerSimInfoSet(p_00->pDataSimCis,iVar13,1);
    iVar2 = p->vCis->nSize;
  }
  puVar5 = Gia_ManTerStateCreate(p_00);
  iVar13 = p_00->nStateWords;
  iVar2 = p_00->nBins;
  pBins = p_00->pBins;
  Gia_ManTerStateInsert(puVar5,iVar13,pBins,iVar2);
  uVar16 = 0;
  puVar5 = (uint *)0x0;
  while( true ) {
    iVar17 = 1;
    if (p->nFront < 1) {
      __assert_fail("p->pAig->nFront > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                    ,0x17a,"void Gia_ManTerSimulateRound(Gia_ManTer_t *)");
    }
    if (p->pObjs->Value != 0) {
      __assert_fail("Gia_ManConst0(p->pAig)->Value == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                    ,0x17b,"void Gia_ManTerSimulateRound(Gia_ManTer_t *)");
    }
    puVar7 = p_00->pDataSim;
    *puVar7 = (*puVar7 & 0xfffffffc) + 1;
    iVar14 = 0;
    i_00 = 0;
    while ((iVar17 < p->nObjs && (pGVar6 = Gia_ManObj(p,iVar17), pGVar6 != (Gia_Obj_t *)0x0))) {
      uVar12 = *(ulong *)pGVar6;
      uVar10 = (uint)uVar12;
      if ((int)uVar10 < 0) {
        uVar11 = pGVar6->Value;
        if ((~uVar10 & 0x9fffffff) == 0) {
          if (p->nFront <= (int)uVar11) {
            __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                          ,0x186,"void Gia_ManTerSimulateRound(Gia_ManTer_t *)");
          }
          Gia_ManTerSimInfoSet
                    (puVar7,uVar11,
                     p_00->pDataSimCis[iVar14 >> 4] >> ((char)iVar14 * '\x02' & 0x1fU) & 3);
          iVar14 = iVar14 + 1;
        }
        else {
          if (uVar11 != 0x1fffffff) {
            __assert_fail("Gia_ObjValue(pObj) == GIA_NONE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                          ,0x18b,"void Gia_ManTerSimulateRound(Gia_ManTer_t *)");
          }
          uVar11 = *(uint *)((long)puVar7 + (ulong)((uVar10 & 0x1ffffff0) >> 2)) >>
                   ((char)uVar12 * '\x02' & 0x1fU) & 3;
          Value = (((uVar10 >> 0x1d & 1) != 0) + 1 != uVar11) + 1;
          if (uVar11 == 3) {
            Value = 3;
          }
          Gia_ManTerSimInfoSet(p_00->pDataSimCos,i_00,Value);
          i_00 = i_00 + 1;
        }
      }
      else {
        if (p->nFront <= (int)pGVar6->Value) {
          __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                        ,0x181,"void Gia_ManTerSimulateRound(Gia_ManTer_t *)");
        }
        uVar3 = *(uint *)((long)puVar7 + (ulong)((uVar10 & 0x1ffffff0) >> 2)) >>
                ((char)uVar12 * '\x02' & 0x1fU) & 3;
        uVar15 = *(uint *)((long)puVar7 + (ulong)(((uint)(uVar12 >> 0x20) & 0x1ffffff0) >> 2)) >>
                 ((char)(uVar12 >> 0x20) * '\x02' & 0x1fU) & 3;
        uVar11 = 1;
        if (((uVar12 >> 0x3d & 1) != 0) + 1 != uVar15) {
          uVar11 = (uVar3 == 3 || uVar15 == 3) | 2;
        }
        if (((uVar10 >> 0x1d & 1) != 0) + 1 == uVar3) {
          uVar11 = 1;
        }
        Gia_ManTerSimInfoSet(puVar7,pGVar6->Value,uVar11);
      }
      iVar17 = iVar17 + 1;
    }
    if (p->vCis->nSize != iVar14) {
      __assert_fail("Gia_ManCiNum(p->pAig) == iCis",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                    ,399,"void Gia_ManTerSimulateRound(Gia_ManTer_t *)");
    }
    if (p->vCos->nSize != i_00) {
      __assert_fail("Gia_ManCoNum(p->pAig) == iCos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                    ,400,"void Gia_ManTerSimulateRound(Gia_ManTer_t *)");
    }
    for (iVar17 = 0; iVar17 < iVar14 - p->nRegs; iVar17 = iVar17 + 1) {
      Gia_ManTerSimInfoSet(p_00->pDataSimCis,iVar17,3);
      iVar14 = p->vCis->nSize;
    }
    for (; iVar17 < iVar14; iVar17 = iVar17 + 1) {
      iVar14 = (p->vCos->nSize - iVar14) + iVar17;
      Gia_ManTerSimInfoSet
                (p_00->pDataSimCis,iVar17,
                 p_00->pDataSimCos[iVar14 >> 4] >> ((char)iVar14 * '\x02' & 0x1fU) & 3);
      iVar14 = p->vCis->nSize;
    }
    puVar7 = Gia_ManTerStateCreate(p_00);
    puVar8 = Gia_ManTerStateLookup(puVar7,iVar13,pBins,iVar2);
    iVar17 = (int)uVar16;
    if (puVar8 != (uint *)0x0) break;
    Gia_ManTerStateInsert(puVar7,iVar13,pBins,iVar2);
    if (((int)(uVar16 % 10) == 0) && (p_00->nIters <= iVar17)) {
      Gia_ManTerRetire(p_00,puVar7,puVar5);
    }
    uVar16 = (ulong)(iVar17 + 1);
    puVar5 = puVar7;
  }
  pVVar1 = p_00->vStates;
  uVar10 = pVVar1->nSize;
  pAig->nTerStates = uVar10;
  uVar12 = 0;
  uVar16 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar16 = uVar12;
  }
  iVar13 = -1;
  do {
    if (uVar16 == uVar12) {
LAB_00212c27:
      pAig->nTerLoop = iVar13;
      if (fVerbose != 0) {
        iVar13 = 0x766273;
        printf("Ternary simulation saturated after %d iterations. ",(ulong)(iVar17 + 1));
        Abc_Print(iVar13,"%s =","Time");
        aVar9 = Abc_Clock();
        Abc_Print(iVar13,"%9.2f sec\n",(double)(aVar9 - aVar4) / 1000000.0);
      }
      return p_00;
    }
    if ((uint *)pVVar1->pArray[uVar12] == puVar8) {
      iVar13 = (int)uVar12;
      goto LAB_00212c27;
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

Gia_ManTer_t * Gia_ManTerSimulate( Gia_Man_t * pAig, int fVerbose )
{
    Gia_ManTer_t * p;
    unsigned * pState, * pPrev, * pLoop;
    int i, Counter;
    abctime clk, clkTotal = Abc_Clock();
    assert( Gia_ManRegNum(pAig) > 0 );
    // create manager
    clk = Abc_Clock();
    p = Gia_ManTerCreate( pAig );
    if ( 0 )
    {
        printf( "Obj = %8d (%8d). F = %6d. ", 
            pAig->nObjs, Gia_ManCiNum(pAig) + Gia_ManAndNum(pAig), p->pAig->nFront );
        printf( "AIG = %7.2f MB. F-mem = %7.2f MB. Other = %7.2f MB.  ", 
            12.0*Gia_ManObjNum(p->pAig)/(1<<20), 
            4.0*Abc_BitWordNum(2 * p->pAig->nFront)/(1<<20), 
            4.0*Abc_BitWordNum(2 * (Gia_ManCiNum(pAig) + Gia_ManCoNum(pAig)))/(1<<20) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    // perform simulation
    Gia_ManTerSimInfoInit( p );
    // hash the first state
    pState = Gia_ManTerStateCreate( p );
    Gia_ManTerStateInsert( pState, p->nStateWords, p->pBins, p->nBins );
//Gia_ManTerStatePrint( pState, Gia_ManRegNum(pAig), 0 );
    // perform simuluation till convergence
    pPrev = NULL;
    for ( i = 0; ; i++ )
    {
        Gia_ManTerSimulateRound( p );
        Gia_ManTerSimInfoTransfer( p );
        pState = Gia_ManTerStateCreate( p );
//Gia_ManTerStatePrint( pState, Gia_ManRegNum(pAig), i+1 );
        if ( (pLoop = Gia_ManTerStateLookup(pState, p->nStateWords, p->pBins, p->nBins)) )
        {
            pAig->nTerStates = Vec_PtrSize( p->vStates );
            pAig->nTerLoop = Vec_PtrFind( p->vStates, pLoop );
            break;
        }
        Gia_ManTerStateInsert( pState, p->nStateWords, p->pBins, p->nBins );
        if ( i >= p->nIters && i % 10 == 0 )
        {
            Counter = Gia_ManTerRetire( p, pState, pPrev );
//            Counter = Gia_ManTerRetire2( p, pState );
//            if ( fVerbose )
//                printf( "Retired %d registers.\n", Counter );
        }
        pPrev = pState;
    }
    if ( fVerbose )
    {
        printf( "Ternary simulation saturated after %d iterations. ", i+1 );
        ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    return p;
}